

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

PLSample __thiscall
pbrt::PiecewiseLinear2D<2UL>::Sample(PiecewiseLinear2D<2UL> *this,Vector2f sample,Float *param)

{
  undefined8 uVar1;
  Tuple2<pbrt::Vector2,_float> TVar2;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar27 [64];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float w0_1;
  undefined1 auVar40 [16];
  float w1_1;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float w0;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float w1;
  float fVar45;
  float fVar46;
  PLSample PVar47;
  float param_weight [4];
  float local_c8 [2];
  uint local_c0;
  float local_bc;
  float local_b0;
  float local_ac;
  undefined1 local_a8 [16];
  ulong local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar27._8_56_ = in_register_00001208;
  auVar27._0_8_ = sample.super_Tuple2<pbrt::Vector2,_float>;
  auVar26 = auVar27._0_16_;
  auVar25 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar26);
  auVar29 = vmovshdup_avx(auVar26);
  auVar24 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar29);
  pvVar3 = (this->m_param_values).ptr;
  iVar7 = 0;
  lVar8 = 0;
  do {
    uVar16 = this->m_param_size[lVar8];
    if ((ulong)uVar16 == 1) {
      uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      *(undefined8 *)(local_c8 + lVar8 * 2) = uVar1;
    }
    else {
      uVar10 = (ulong)uVar16 - 2;
      lVar9 = 1;
      if (2 < uVar16) {
        lVar9 = 1;
        uVar12 = uVar10;
        do {
          uVar15 = uVar12 >> 1;
          if (pvVar3[lVar8].ptr[uVar15 + lVar9 & 0xffffffff] <= param[lVar8]) {
            lVar9 = uVar15 + 1 + lVar9;
            uVar15 = ~uVar15 + uVar12;
          }
          uVar12 = uVar15;
        } while (0 < (long)uVar15);
      }
      if (lVar9 - 1U < uVar10) {
        uVar10 = lVar9 - 1U;
      }
      if (lVar9 < 1) {
        uVar10 = 0;
      }
      pfVar4 = pvVar3[lVar8].ptr;
      fVar23 = pfVar4[uVar10 & 0xffffffff];
      auVar32 = ZEXT416((uint)((param[lVar8] - fVar23) / (pfVar4[(int)uVar10 + 1] - fVar23)));
      auVar31 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar32);
      uVar1 = vcmpss_avx512f(auVar32,ZEXT816(0) << 0x40,1);
      fVar23 = (float)((uint)!(bool)((byte)uVar1 & 1) * auVar31._0_4_);
      local_c8[lVar8 * 2 + 1] = fVar23;
      local_c8[lVar8 * 2] = 1.0 - fVar23;
      iVar7 = (int)uVar10 * this->m_param_strides[lVar8] + iVar7;
    }
    bVar22 = lVar8 == 0;
    lVar8 = lVar8 + 1;
  } while (bVar22);
  uVar1 = vcmpss_avx512f(auVar26,SUB6416(ZEXT464(0x33800000),0),1);
  bVar22 = (bool)((byte)uVar1 & 1);
  local_a8._4_12_ = auVar25._4_12_;
  local_a8._0_4_ = (float)((uint)bVar22 * 0x33800000 + (uint)!bVar22 * auVar25._0_4_);
  uVar1 = vcmpss_avx512f(auVar29,SUB6416(ZEXT464(0x33800000),0),1);
  bVar22 = (bool)((byte)uVar1 & 1);
  fVar23 = (float)((uint)bVar22 * 0x33800000 + (uint)!bVar22 * auVar24._0_4_);
  iVar18 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
  local_90 = (long)iVar18 - 2;
  lVar8 = 1;
  if (2 < (long)iVar18) {
    pfVar4 = (this->m_marginal_cdf).ptr;
    iVar11 = this->m_param_strides[0] * iVar18;
    uVar10 = local_90;
    do {
      uVar12 = uVar10 >> 1;
      uVar16 = (int)uVar12 + (int)lVar8 + iVar18 * iVar7;
      uVar17 = uVar16 + this->m_param_strides[1] * iVar18;
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar4[uVar16 + iVar11])),
                                ZEXT416((uint)local_c8[0]),ZEXT416((uint)pfVar4[uVar16]));
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar4[uVar17 + iVar11])),
                                ZEXT416((uint)local_c8[0]),ZEXT416((uint)pfVar4[uVar17]));
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(local_bc * auVar24._0_4_)),ZEXT416(local_c0),auVar25)
      ;
      if (auVar25._0_4_ < fVar23) {
        lVar8 = uVar12 + 1 + lVar8;
        uVar12 = ~uVar12 + uVar10;
      }
      uVar10 = uVar12;
    } while (0 < (long)uVar12);
  }
  if (lVar8 - 1U < local_90) {
    local_90 = lVar8 - 1U;
  }
  local_90 = local_90 & 0xffffffff;
  if (lVar8 < 1) {
    local_90 = 0;
  }
  pfVar4 = (this->m_marginal_cdf).ptr;
  uVar16 = iVar18 * iVar7 + (int)local_90;
  uVar17 = this->m_param_strides[1] * iVar18 + uVar16;
  local_68 = ZEXT416(local_c0);
  iVar11 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
  iVar14 = this->m_param_strides[0] * iVar18;
  local_88 = ZEXT416((uint)local_c8[0]);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar4[iVar14 + uVar16])),
                            ZEXT416((uint)local_c8[0]),ZEXT416((uint)pfVar4[uVar16]));
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar4[iVar14 + uVar17])),
                            ZEXT416((uint)local_c8[0]),ZEXT416((uint)pfVar4[uVar17]));
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(local_bc * auVar24._0_4_)),ZEXT416(local_c0),auVar25);
  fVar23 = fVar23 - auVar25._0_4_;
  iVar18 = iVar11 * iVar18;
  iVar19 = iVar7 * iVar18 + iVar11 * (int)local_90;
  pfVar4 = (this->m_conditional_cdf).ptr;
  uVar16 = iVar11 + -1 + iVar19;
  iVar7 = this->m_param_strides[1] * iVar18;
  uVar17 = uVar16 + iVar7;
  iVar14 = this->m_param_strides[0] * iVar18;
  auVar29 = ZEXT416((uint)local_c8[0]);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar4[uVar16 + iVar14])),auVar29,
                            ZEXT416((uint)pfVar4[uVar16]));
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar4[uVar17 + iVar14])),auVar29,
                            ZEXT416((uint)pfVar4[uVar17]));
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(local_bc * auVar24._0_4_)),ZEXT416(local_c0),auVar25);
  uVar16 = iVar19 + -1 + iVar11 * 2;
  uVar17 = iVar7 + uVar16;
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar4[uVar16 + iVar14])),auVar29,
                            ZEXT416((uint)pfVar4[uVar16]));
  auVar29 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar4[iVar14 + uVar17])),auVar29,
                            ZEXT416((uint)pfVar4[uVar17]));
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_bc * auVar29._0_4_)),ZEXT416(local_c0),auVar24);
  fVar46 = auVar24._0_4_;
  fVar37 = auVar25._0_4_;
  fVar28 = fVar37 - fVar46;
  auVar24._8_4_ = 0x7fffffff;
  auVar24._0_8_ = 0x7fffffff7fffffff;
  auVar24._12_4_ = 0x7fffffff;
  auVar24 = vandps_avx512vl(ZEXT416((uint)fVar28),auVar24);
  fVar45 = fVar46 + fVar37;
  if (fVar45 * 0.0001 <= auVar24._0_4_) {
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar23 * -2.0)),auVar25,auVar25);
    auVar29._0_12_ = ZEXT812(0);
    auVar29._12_4_ = 0;
    auVar24 = vmaxss_avx(auVar24,auVar29);
    if (auVar24._0_4_ < 0.0) {
      local_78 = ZEXT416((uint)local_bc);
      local_88 = ZEXT416((uint)local_c8[0]);
      local_48 = ZEXT416((uint)local_c8[1]);
      local_b0 = fVar46;
      local_ac = fVar37;
      local_68 = ZEXT416(local_c0);
      local_58 = ZEXT416((uint)fVar28);
      fVar23 = sqrtf(auVar24._0_4_);
      auVar25 = ZEXT416((uint)local_ac);
      fVar46 = local_b0;
      local_c8[1] = (float)local_48._0_4_;
      local_bc = (float)local_78._0_4_;
      fVar45 = (float)local_58._0_4_;
    }
    else {
      auVar24 = vsqrtss_avx(auVar24,auVar24);
      fVar23 = auVar24._0_4_;
      local_88 = ZEXT416((uint)local_c8[0]);
      local_68 = ZEXT416(local_c0);
      fVar45 = fVar28;
    }
    fVar28 = local_a8._0_4_;
    fVar23 = auVar25._0_4_ - fVar23;
  }
  else {
    fVar23 = fVar23 + fVar23;
    fVar28 = local_a8._0_4_;
  }
  uVar12 = local_90;
  fVar23 = fVar23 / fVar45;
  local_a8 = ZEXT416((uint)fVar23);
  fVar45 = 1.0 - fVar23;
  auVar25 = vfmadd213ss_fma(auVar25,ZEXT416((uint)fVar45),ZEXT416((uint)(fVar46 * fVar23)));
  fVar28 = fVar28 * auVar25._0_4_;
  lVar9 = (long)(this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
  uVar10 = lVar9 - 2;
  lVar8 = 1;
  if (2 < lVar9) {
    pfVar4 = (this->m_conditional_cdf).ptr;
    iVar7 = this->m_param_strides[0] * iVar18;
    uVar15 = uVar10;
    do {
      uVar13 = uVar15 >> 1;
      uVar17 = (int)uVar13 + (int)lVar8 + iVar19;
      uVar16 = uVar17 + this->m_param_strides[1] * iVar18;
      uVar21 = (ulong)(uVar17 + iVar7);
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar4[uVar21])),local_88,
                                ZEXT416((uint)pfVar4[uVar17]));
      uVar6 = (ulong)(uVar16 + iVar7);
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar4[uVar6])),local_88,
                                ZEXT416((uint)pfVar4[uVar16]));
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(local_bc * auVar24._0_4_)),local_68,auVar25);
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar4[lVar9 + uVar21])),local_88,
                                ZEXT416((uint)pfVar4[lVar9 + (ulong)uVar17]));
      auVar29 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar4[lVar9 + uVar6])),local_88,
                                ZEXT416((uint)pfVar4[lVar9 + (ulong)uVar16]));
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_bc * auVar29._0_4_)),local_68,auVar24);
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * auVar24._0_4_)),ZEXT416((uint)fVar45),
                                auVar25);
      if (auVar25._0_4_ < fVar28) {
        lVar8 = uVar13 + 1 + lVar8;
        uVar13 = ~uVar13 + uVar15;
      }
      uVar15 = uVar13;
    } while (0 < (long)uVar13);
  }
  if (lVar8 - 1U < uVar10) {
    uVar10 = lVar8 - 1U;
  }
  uVar16 = (uint)uVar10;
  if (lVar8 < 1) {
    uVar16 = 0;
  }
  pfVar4 = (this->m_data).ptr;
  pfVar5 = (this->m_conditional_cdf).ptr;
  uVar20 = iVar19 + uVar16;
  uVar17 = this->m_param_strides[1] * iVar18 + uVar20;
  iVar18 = iVar18 * this->m_param_strides[0];
  uVar10 = (ulong)(uVar20 + iVar18);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar5[uVar10])),local_88,
                            ZEXT416((uint)pfVar5[uVar20]));
  uVar15 = (ulong)(iVar18 + uVar17);
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar5[uVar15])),local_88,
                            ZEXT416((uint)pfVar5[uVar17]));
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(local_bc * auVar24._0_4_)),local_68,auVar25);
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar5[lVar9 + uVar10])),local_88,
                            ZEXT416((uint)pfVar5[lVar9 + (ulong)uVar20]));
  auVar29 = vfmadd231ss_fma(ZEXT416((uint)(local_c8[1] * pfVar5[lVar9 + uVar15])),local_88,
                            ZEXT416((uint)pfVar5[lVar9 + (ulong)uVar17]));
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_bc * auVar29._0_4_)),local_68,auVar24);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * auVar24._0_4_)),ZEXT416((uint)fVar45),auVar25);
  fVar28 = fVar28 - auVar25._0_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(pfVar4 + uVar20);
  auVar34._0_4_ = local_c8[1] * (float)*(undefined8 *)(pfVar4 + uVar10);
  auVar34._4_4_ = local_c8[1] * (float)((ulong)*(undefined8 *)(pfVar4 + uVar10) >> 0x20);
  auVar34._8_4_ = local_c8[1] * 0.0;
  auVar34._12_4_ = local_c8[1] * 0.0;
  auVar40._0_4_ = local_88._0_4_;
  auVar40._4_4_ = auVar40._0_4_;
  auVar40._8_4_ = auVar40._0_4_;
  auVar40._12_4_ = auVar40._0_4_;
  auVar25 = vfmadd231ps_fma(auVar34,auVar40,auVar26);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(pfVar4 + uVar17);
  auVar41._0_4_ = local_c8[1] * (float)*(undefined8 *)(pfVar4 + uVar15);
  auVar41._4_4_ = local_c8[1] * (float)((ulong)*(undefined8 *)(pfVar4 + uVar15) >> 0x20);
  auVar41._8_4_ = local_c8[1] * 0.0;
  auVar41._12_4_ = local_c8[1] * 0.0;
  auVar24 = vfmadd231ps_fma(auVar41,auVar40,auVar31);
  auVar42._0_4_ = local_bc * auVar24._0_4_;
  auVar42._4_4_ = local_bc * auVar24._4_4_;
  auVar42._8_4_ = local_bc * auVar24._8_4_;
  auVar42._12_4_ = local_bc * auVar24._12_4_;
  auVar43._0_4_ = local_68._0_4_;
  auVar43._4_4_ = auVar43._0_4_;
  auVar43._8_4_ = auVar43._0_4_;
  auVar43._12_4_ = auVar43._0_4_;
  auVar25 = vfmadd231ps_fma(auVar42,auVar43,auVar25);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(pfVar4 + lVar9 + (ulong)uVar20);
  auVar44._0_4_ = (float)*(undefined8 *)(pfVar4 + lVar9 + uVar10) * local_c8[1];
  auVar44._4_4_ = (float)((ulong)*(undefined8 *)(pfVar4 + lVar9 + uVar10) >> 0x20) * local_c8[1];
  auVar44._8_4_ = local_c8[1] * 0.0;
  auVar44._12_4_ = local_c8[1] * 0.0;
  auVar24 = vfmadd231ps_fma(auVar44,auVar40,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(pfVar4 + lVar9 + (ulong)uVar17);
  auVar38._0_4_ = (float)*(undefined8 *)(pfVar4 + lVar9 + uVar15) * local_c8[1];
  auVar38._4_4_ = (float)((ulong)*(undefined8 *)(pfVar4 + lVar9 + uVar15) >> 0x20) * local_c8[1];
  auVar38._8_4_ = local_c8[1] * 0.0;
  auVar38._12_4_ = local_c8[1] * 0.0;
  auVar29 = vfmadd231ps_fma(auVar38,auVar40,auVar36);
  auVar32._0_4_ = local_bc * auVar29._0_4_;
  auVar32._4_4_ = local_bc * auVar29._4_4_;
  auVar32._8_4_ = local_bc * auVar29._8_4_;
  auVar32._12_4_ = local_bc * auVar29._12_4_;
  auVar24 = vfmadd231ps_fma(auVar32,auVar43,auVar24);
  auVar33._0_4_ = fVar23 * auVar24._0_4_;
  auVar33._4_4_ = fVar23 * auVar24._4_4_;
  auVar33._8_4_ = fVar23 * auVar24._8_4_;
  auVar33._12_4_ = fVar23 * auVar24._12_4_;
  auVar39._4_4_ = fVar45;
  auVar39._0_4_ = fVar45;
  auVar39._8_4_ = fVar45;
  auVar39._12_4_ = fVar45;
  local_68 = vfmadd213ps_fma(auVar39,auVar25,auVar33);
  local_78 = vmovshdup_avx(local_68);
  fVar45 = local_78._0_4_;
  fVar23 = local_68._0_4_ - fVar45;
  auVar25._8_4_ = 0x7fffffff;
  auVar25._0_8_ = 0x7fffffff7fffffff;
  auVar25._12_4_ = 0x7fffffff;
  auVar25 = vandps_avx512vl(ZEXT416((uint)fVar23),auVar25);
  local_88._0_4_ = local_68._0_4_ + fVar45;
  if ((float)local_88._0_4_ * 0.0001 <= auVar25._0_4_) {
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * -2.0 * fVar23)),local_68,local_68);
    auVar30._0_12_ = ZEXT812(0);
    auVar30._12_4_ = 0;
    auVar25 = vmaxss_avx(auVar25,auVar30);
    if (auVar25._0_4_ < 0.0) {
      local_88 = ZEXT416((uint)fVar23);
      fVar28 = sqrtf(auVar25._0_4_);
    }
    else {
      auVar25 = vsqrtss_avx(auVar25,auVar25);
      fVar28 = auVar25._0_4_;
      local_88._0_4_ = fVar23;
    }
    fVar45 = local_78._0_4_;
    fVar28 = local_68._0_4_ - fVar28;
  }
  else {
    fVar28 = fVar28 + fVar28;
  }
  fVar28 = fVar28 / (float)local_88._0_4_;
  auVar25 = vpinsrd_avx(ZEXT416(uVar16),(int)uVar12,1);
  auVar24 = vcvtudq2ps_avx512vl(auVar25);
  auVar25 = vinsertps_avx(ZEXT416((uint)fVar28),local_a8,0x10);
  TVar2 = (this->m_patch_size).super_Tuple2<pbrt::Vector2,_float>;
  PVar47.p.super_Tuple2<pbrt::Vector2,_float>.x = TVar2.x * (auVar25._0_4_ + auVar24._0_4_);
  PVar47.p.super_Tuple2<pbrt::Vector2,_float>.y = TVar2.y * (auVar25._4_4_ + auVar24._4_4_);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar45 * fVar28)),local_68,ZEXT416((uint)(1.0 - fVar28)))
  ;
  PVar47.pdf = auVar25._0_4_ *
               (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x *
               (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y;
  return PVar47;
}

Assistant:

PBRT_CPU_GPU
    PLSample Sample(Vector2f sample, const Float *param = nullptr) const {
        /* Avoid degeneracies at the extrema */
        sample[0] = Clamp(sample[0], 1 - OneMinusEpsilon, OneMinusEpsilon);
        sample[1] = Clamp(sample[1], 1 - OneMinusEpsilon, OneMinusEpsilon);

        /* Look up parameter-related indices and weights (if Dimension != 0) */
        float param_weight[2 * ArraySize];
        uint32_t slice_offset = 0u;
        for (size_t dim = 0; dim < Dimension; ++dim) {
            if (m_param_size[dim] == 1) {
                param_weight[2 * dim] = 1.f;
                param_weight[2 * dim + 1] = 0.f;
                continue;
            }

            uint32_t param_index = FindInterval(m_param_size[dim], [&](uint32_t idx) {
                return m_param_values[dim].data()[idx] <= param[dim];
            });

            float p0 = m_param_values[dim][param_index],
                  p1 = m_param_values[dim][param_index + 1];

            param_weight[2 * dim + 1] = Clamp((param[dim] - p0) / (p1 - p0), 0.f, 1.f);
            param_weight[2 * dim] = 1.f - param_weight[2 * dim + 1];
            slice_offset += m_param_strides[dim] * param_index;
        }

        /* Sample the row first */
        uint32_t offset = 0;
        if (Dimension != 0)
            offset = slice_offset * m_size.y;

        auto fetch_marginal = [&](uint32_t idx) -> float {
            return lookup<Dimension>(m_marginal_cdf.data(), offset + idx, m_size.y,
                                     param_weight);
        };

        uint32_t row = FindInterval(
            m_size.y, [&](uint32_t idx) { return fetch_marginal(idx) < sample.y; });

        sample.y -= fetch_marginal(row);

        uint32_t slice_size = HProd(m_size);
        offset = row * m_size.x;
        if (Dimension != 0)
            offset += slice_offset * slice_size;

        float r0 = lookup<Dimension>(m_conditional_cdf.data(), offset + m_size.x - 1,
                                     slice_size, param_weight),
              r1 =
                  lookup<Dimension>(m_conditional_cdf.data(), offset + (m_size.x * 2 - 1),
                                    slice_size, param_weight);

        bool is_const = std::abs(r0 - r1) < 1e-4f * (r0 + r1);
        sample.y = is_const ? (2.f * sample.y)
                            : (r0 - SafeSqrt(r0 * r0 - 2.f * sample.y * (r0 - r1)));
        sample.y /= is_const ? (r0 + r1) : (r0 - r1);

        /* Sample the column next */
        sample.x *= (1.f - sample.y) * r0 + sample.y * r1;

        auto fetch_conditional = [&](uint32_t idx) -> float {
            float v0 = lookup<Dimension>(m_conditional_cdf.data(), offset + idx,
                                         slice_size, param_weight),
                  v1 = lookup<Dimension>(m_conditional_cdf.data() + m_size.x,
                                         offset + idx, slice_size, param_weight);

            return (1.f - sample.y) * v0 + sample.y * v1;
        };

        uint32_t col = FindInterval(
            m_size.x, [&](uint32_t idx) { return fetch_conditional(idx) < sample.x; });

        sample.x -= fetch_conditional(col);

        offset += col;

        float v00 = lookup<Dimension>(m_data.data(), offset, slice_size, param_weight),
              v10 =
                  lookup<Dimension>(m_data.data() + 1, offset, slice_size, param_weight),
              v01 = lookup<Dimension>(m_data.data() + m_size.x, offset, slice_size,
                                      param_weight),
              v11 = lookup<Dimension>(m_data.data() + m_size.x + 1, offset, slice_size,
                                      param_weight),
              c0 = std::fma((1.f - sample.y), v00, sample.y * v01),
              c1 = std::fma((1.f - sample.y), v10, sample.y * v11);

        is_const = std::abs(c0 - c1) < 1e-4f * (c0 + c1);
        sample.x = is_const ? (2.f * sample.x)
                            : (c0 - SafeSqrt(c0 * c0 - 2.f * sample.x * (c0 - c1)));
        sample.x /= is_const ? (c0 + c1) : (c0 - c1);

        return {Vector2f((col + sample.x) * m_patch_size.x,
                         (row + sample.y) * m_patch_size.y),
                ((1.f - sample.x) * c0 + sample.x * c1) * HProd(m_inv_patch_size)};
    }